

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_compression_store.c
# Opt level: O2

void test_write_format_zip_compression_store(void)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [8];
  size_t sVar5;
  int iVar6;
  tm *ptVar7;
  archive *_a;
  archive_entry *paVar8;
  ssize_t sVar9;
  unsigned_long c;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  char *pcVar13;
  size_t s;
  size_t s_00;
  char *_v1;
  long lVar14;
  ulong uVar15;
  char *_v1_00;
  char file_data2 [5];
  time_t t;
  char *pcStack_18738;
  char file_data1 [5];
  char file_name [5];
  char folder_name [8];
  undefined8 uStack_186f0;
  undefined1 auStack_186e8 [8];
  size_t used;
  char buff [100000];
  
  builtin_strncpy(file_name,"file",5);
  builtin_strncpy(file_data1,"12345",5);
  builtin_strncpy(file_data2,"67890",5);
  builtin_strncpy(folder_name,"folder/",8);
  t = time((time_t *)0x0);
  ptVar7 = localtime(&t);
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                   ,L'c',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar6 = archive_write_set_format_zip(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'd',0,"ARCHIVE_OK",(long)iVar6,"archive_write_set_format_zip(a)",_a);
  iVar6 = archive_write_set_options(_a,"zip:compression=store");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'f',0,"ARCHIVE_OK",(long)iVar6,
                      "archive_write_set_options(a, \"zip:compression=store\")",_a);
  iVar6 = archive_write_set_options(_a,"zip:experimental");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'h',0,"ARCHIVE_OK",(long)iVar6,
                      "archive_write_set_options(a, \"zip:experimental\")",_a);
  iVar6 = archive_write_add_filter_none(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'i',0,"ARCHIVE_OK",(long)iVar6,"archive_write_add_filter_none(a)",_a);
  iVar6 = archive_write_set_bytes_per_block(_a,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'j',0,"ARCHIVE_OK",(long)iVar6,"archive_write_set_bytes_per_block(a, 1)",_a)
  ;
  iVar6 = archive_write_set_bytes_in_last_block(_a,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'k',0,"ARCHIVE_OK",(long)iVar6,"archive_write_set_bytes_in_last_block(a, 1)"
                      ,_a);
  iVar6 = archive_write_open_memory(_a,buff,100000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'l',0,"ARCHIVE_OK",(long)iVar6,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",_a);
  paVar8 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                   ,L'q',(uint)(paVar8 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname(paVar8,file_name);
  archive_entry_set_mode(paVar8,0x81a4);
  archive_entry_set_size(paVar8,10);
  archive_entry_set_uid(paVar8,10);
  archive_entry_set_gid(paVar8,0x14);
  archive_entry_set_mtime(paVar8,t,0);
  archive_entry_set_atime(paVar8,t + 3,0);
  iVar6 = archive_write_header(_a,paVar8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'y',0,"0",(long)iVar6,"archive_write_header(a, entry)",_a);
  sVar9 = archive_write_data(_a,file_data1,5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'z',5,"sizeof(file_data1)",sVar9,
                      "archive_write_data(a, file_data1, sizeof(file_data1))",_a);
  sVar9 = archive_write_data(_a,file_data2,5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'{',5,"sizeof(file_data2)",sVar9,
                      "archive_write_data(a, file_data2, sizeof(file_data2))",_a);
  archive_entry_free(paVar8);
  paVar8 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                   ,L'\x7f',(uint)(paVar8 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname(paVar8,folder_name);
  archive_entry_set_mode(paVar8,0x41ed);
  archive_entry_set_size(paVar8,0);
  archive_entry_set_uid(paVar8,0x1e);
  archive_entry_set_gid(paVar8,0x28);
  archive_entry_set_mtime(paVar8,t,0);
  archive_entry_set_ctime(paVar8,t + 5,0);
  iVar6 = archive_write_header(_a,paVar8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x87',0,"0",(long)iVar6,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar8);
  iVar6 = archive_write_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x8b',0,"ARCHIVE_OK",(long)iVar6,"archive_write_close(a)",_a);
  iVar6 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x8c',0,"ARCHIVE_OK",(long)iVar6,"archive_write_free(a)",(void *)0x0);
  dumpfile("constructed.zip",buff,used);
  sVar5 = used;
  lVar14 = used + 2;
  failure("End-of-central-directory begins with PK\\005\\006 signature");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x97',(void *)((long)&uStack_186f0 + lVar14),"p","PK\x05\x06",
                      "\"PK\\005\\006\"",4,"4",(void *)0x0);
  failure("This must be disk 0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x99',(ulong)*(ushort *)((long)&uStack_186f0 + sVar5 + 6),"i2(p + 4)",0,"0"
                      ,(void *)0x0);
  failure("Central dir must start on disk 0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x9b',(ulong)*(ushort *)(auStack_186e8 + sVar5),"i2(p + 6)",0,"0",
                      (void *)0x0);
  failure("All central dir entries are on this disk");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x9d',(ulong)*(ushort *)(auStack_186e8 + sVar5 + 2),"i2(p + 8)",
                      (ulong)*(ushort *)(auStack_186e8 + sVar5 + 4),"i2(p + 10)",(void *)0x0);
  failure("CD start (%d) + CD length (%d) should == archive size - 22",
          (ulong)*(uint *)(auStack_186e8 + sVar5 + 6),(ulong)*(uint *)(buff + (sVar5 - 6)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\xa0',(long)*(int *)(buff + (sVar5 - 6)) +
                               (long)*(int *)(auStack_186e8 + sVar5 + 6),"i4(p + 12) + i4(p + 16)",
                      used - 0x16,"used - 22",(void *)0x0);
  failure("no zip comment");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¢',(ulong)*(ushort *)(buff + (sVar5 - 2)),"i2(p + 20)",0,"0",(void *)0x0);
  lVar14 = (long)*(int *)(buff + (sVar5 - 6));
  _v1_00 = buff + lVar14;
  failure("Central file record at offset %d should begin with PK\\001\\002 signature",
          (ulong)*(uint *)(auStack_186e8 + sVar5 + 6));
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'«',_v1_00,"p","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¬',(ulong)*(ushort *)(buff + lVar14 + 4),"i2(p + 4)",0x30a,"3 * 256 + 10",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'­',(ulong)*(ushort *)(buff + lVar14 + 6),"i2(p + 6)",10,"10",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'®',(ulong)*(ushort *)(buff + lVar14 + 8),"i2(p + 8)",8,"8",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¯',(ulong)*(ushort *)(buff + lVar14 + 10),"i2(p + 10)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'°',(ulong)*(ushort *)(buff + lVar14 + 0xc),"i2(p + 12)",
                      (long)(ptVar7->tm_sec / 2 + ptVar7->tm_min * 0x20 + ptVar7->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'±',(ulong)*(ushort *)(buff + lVar14 + 0xe),"i2(p + 14)",
                      (long)(ptVar7->tm_mon * 0x20 + ptVar7->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar7->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  c = bitcrc32(0,file_data1,s);
  pcStack_18738 = (char *)bitcrc32(c,file_data2,s_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'´',(long)*(int *)(buff + lVar14 + 0x10),"i4(p + 16)",
                      (longlong)pcStack_18738,"crc",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'µ',(long)*(int *)(buff + lVar14 + 0x14),"i4(p + 20)",10,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¶',(long)*(int *)(buff + lVar14 + 0x18),"i4(p + 24)",10,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  uVar1 = *(ushort *)(buff + lVar14 + 0x1c);
  sVar10 = strlen(file_name);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'·',(ulong)uVar1,"i2(p + 28)",sVar10,"strlen(file_name)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¸',(ulong)*(ushort *)(buff + lVar14 + 0x1e),"i2(p + 30)",0x1c,"28",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¹',(ulong)*(ushort *)(buff + lVar14 + 0x20),"i2(p + 32)",0,"0",(void *)0x0
                     );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'º',(ulong)*(ushort *)(buff + lVar14 + 0x22),"i2(p + 34)",0,"0",(void *)0x0
                     );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'»',(ulong)*(ushort *)(buff + lVar14 + 0x24),"i2(p + 36)",0,"0",(void *)0x0
                     );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¼',(ulong)*(ushort *)(buff + lVar14 + 0x28) & 0x3ff,
                      "i4(p + 38) >> 16 & 01777",0x1a4,"file_perm",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'½',(long)*(int *)(buff + lVar14 + 0x2a),"i4(p + 42)",0,"0",(void *)0x0);
  sVar10 = strlen(file_name);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¾',buff + lVar14 + 0x2e,"p + 46",file_name,"file_name",sVar10,
                      "strlen(file_name)",(void *)0x0);
  sVar10 = strlen(file_name);
  lVar14 = sVar10 + 0x2e;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'À',(ulong)*(ushort *)(_v1_00 + sVar10 + 0x2e),"i2(p)",0x5455,"0x5455",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Á',(ulong)*(ushort *)(_v1_00 + sVar10 + 0x30),"i2(p + 2)",9,"9",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Â',(long)_v1_00[sVar10 + 0x32],"p[4]",3,"3",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ã',(long)*(int *)(_v1_00 + sVar10 + 0x33),"i4(p + 5)",t,"t",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ä',(long)*(int *)(_v1_00 + sVar10 + 0x37),"i4(p + 9)",t + 3,"t + 3",
                      (void *)0x0);
  uVar11 = (ulong)*(ushort *)(_v1_00 + sVar10 + 0x30);
  lVar2 = uVar11 + lVar14 + 4;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Æ',(ulong)*(ushort *)(_v1_00 + uVar11 + 4 + lVar14),"i2(p)",0x7875,
                      "0x7875",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ç',(ulong)*(ushort *)(_v1_00 + uVar11 + 6 + lVar14),"i2(p + 2)",0xb,"11",
                      (void *)0x0);
  uVar1 = *(ushort *)(_v1_00 + uVar11 + 6 + lVar14);
  auStack_186e8 = (undefined1  [8])(_v1_00 + (ulong)uVar1 + lVar2);
  pcVar13 = (char *)((long)auStack_186e8 + 4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Í',buff,"q","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Î',(ulong)(ushort)buff._4_2_,"i2(q + 4)",10,"10",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ï',(ulong)(ushort)buff._6_2_,"i2(q + 6)",8,"8",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ð',(ulong)(ushort)buff._8_2_,"i2(q + 8)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ñ',(ulong)(ushort)buff._10_2_,"i2(q + 10)",
                      (long)(ptVar7->tm_sec / 2 + ptVar7->tm_min * 0x20 + ptVar7->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ò',(ulong)(ushort)buff._12_2_,"i2(q + 12)",
                      (long)(ptVar7->tm_mon * 0x20 + ptVar7->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar7->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ó',(long)(int)buff._14_4_,"i4(q + 14)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ô',(long)(int)buff._18_4_,"i4(q + 18)",10,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Õ',(long)(int)buff._22_4_,"i4(q + 22)",10,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  sVar10 = strlen(file_name);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ö',(ulong)(ushort)buff._26_2_,"i2(q + 26)",sVar10,"strlen(file_name)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'×',(ulong)(ushort)buff._28_2_,"i2(q + 28)",0x29,"41",(void *)0x0);
  sVar10 = strlen(file_name);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ø',buff + 0x1e,"q + 30",file_name,"file_name",sVar10,"strlen(file_name)",
                      (void *)0x0);
  sVar10 = strlen(file_name);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ú',(ulong)*(ushort *)(buff + sVar10 + 0x1e),"i2(q)",0x5455,"0x5455",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Û',(ulong)*(ushort *)(buff + sVar10 + 0x20),"i2(q + 2)",9,"9",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ü',(long)buff[sVar10 + 0x22],"q[4]",3,"3",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ý',(long)*(int *)(buff + sVar10 + 0x23),"i4(q + 5)",t,"t",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Þ',(long)*(int *)(buff + sVar10 + 0x27),"i4(q + 9)",t + 3,"t + 3",
                      (void *)0x0);
  uVar11 = (ulong)*(ushort *)(buff + sVar10 + 0x20);
  lVar14 = uVar11 + sVar10 + -0x186b6;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'á',(ulong)*(ushort *)(buff + uVar11 + sVar10 + 0x22),"i2(q)",0x7875,
                      "0x7875",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'â',(ulong)*(ushort *)(buff + uVar11 + sVar10 + 0x24),"i2(q + 2)",0xb,"11",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ã',(long)buff[uVar11 + sVar10 + 0x26],"q[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ä',(long)buff[uVar11 + sVar10 + 0x27],"q[5]",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'å',(long)*(int *)(buff + uVar11 + sVar10 + 0x28),"i4(q + 6)",10,"file_uid"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'æ',(long)buff[uVar11 + sVar10 + 0x2c],"q[10]",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ç',(long)*(int *)(buff + uVar11 + sVar10 + 0x2d),"i4(q + 11)",0x14,
                      "file_gid",(void *)0x0);
  uVar11 = (ulong)*(ushort *)(buff + uVar11 + sVar10 + 0x24);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ê',(ulong)*(ushort *)(buff + uVar11 + lVar14 + 0x186dc),"i2(q)",0x6c65,
                      "0x6c65",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ë',(ulong)*(ushort *)(buff + uVar11 + lVar14 + 0x186de),"i2(q + 2)",9,"9",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ì',(long)buff[uVar11 + lVar14 + 0x186e0],"q[4]",7,"7",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'í',(ulong)(byte)buff[uVar11 + lVar14 + 0x186e2],"i2(q + 5) >> 8",3,"3",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'î',(ulong)*(ushort *)(buff + uVar11 + lVar14 + 0x186e3),"i2(q + 7)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ï',(ulong)*(ushort *)(buff + uVar11 + lVar14 + 0x186e7) & 0x3ff,
                      "i4(q + 9) >> 16 & 01777",0x1a4,"file_perm",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                   ,L'ò',(uint)(buff + (ulong)*(ushort *)(buff + uVar11 + lVar14 + 0x186de) +
                                        uVar11 + lVar14 + 0x186e0 ==
                                buff + (ushort)buff._28_2_ + sVar10 + 0x1e),
                   "q == extra_start + i2(local_header + 28)",(void *)0x0);
  uVar11 = (ulong)(ushort)buff._28_2_;
  _v1 = buff + uVar11 + sVar10 + 0x1e;
  uStack_186f0 = _v1;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ö',_v1,"q",file_data1,"file_data1",5,"sizeof(file_data1)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'÷',_v1 + 5,"q + sizeof(file_data1)",file_data2,"file_data2",5,
                      "sizeof(file_data2)",(void *)0x0);
  lVar14 = uVar11 + sVar10;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'û',buff + lVar14 + 0x28,"q","PK\a\b","\"PK\\007\\010\"",4,"4",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ü',(long)*(int *)(buff + lVar14 + 0x2c),"i4(q + 4)",
                      (longlong)pcStack_18738,"crc",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ý',(long)*(int *)(buff + lVar14 + 0x30),"i4(q + 8)",10,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'þ',(long)*(int *)(buff + lVar14 + 0x34),"i4(q + 12)",10,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  pcStack_18738 = buff + uVar11 + sVar10 + 0x38;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ă',pcVar13,"p","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  lVar2 = (ulong)uVar1 + lVar2;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ă',(ulong)*(ushort *)(_v1_00 + lVar2 + 8),"i2(p + 4)",0x314,"3 * 256 + 20"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ą',(ulong)*(ushort *)(_v1_00 + lVar2 + 10),"i2(p + 6)",0x14,"20",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ą',(ulong)*(ushort *)(_v1_00 + lVar2 + 0xc),"i2(p + 8)",0,"0",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ć',(ulong)*(ushort *)(_v1_00 + lVar2 + 0xe),"i2(p + 10)",0,"0",(void *)0x0
                     );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ć',(ulong)*(ushort *)(_v1_00 + lVar2 + 0x10),"i2(p + 12)",
                      (long)(ptVar7->tm_sec / 2 + ptVar7->tm_min * 0x20 + ptVar7->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĉ',(ulong)*(ushort *)(_v1_00 + lVar2 + 0x12),"i2(p + 14)",
                      (long)(ptVar7->tm_mon * 0x20 + ptVar7->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar7->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ċ',(long)*(int *)(_v1_00 + lVar2 + 0x14),"i4(p + 16)",0,"crc",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ċ',(long)*(int *)(_v1_00 + lVar2 + 0x18),"i4(p + 20)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Č',(long)*(int *)(_v1_00 + lVar2 + 0x1c),"i4(p + 24)",0,"0",(void *)0x0);
  uVar1 = *(ushort *)(_v1_00 + lVar2 + 0x20);
  sVar12 = strlen(folder_name);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'č',(ulong)uVar1,"i2(p + 28)",sVar12,"strlen(folder_name)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ď',(ulong)*(ushort *)(_v1_00 + lVar2 + 0x22),"i2(p + 30)",0x1c,"28",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ď',(ulong)*(ushort *)(_v1_00 + lVar2 + 0x24),"i2(p + 32)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Đ',(ulong)*(ushort *)(_v1_00 + lVar2 + 0x26),"i2(p + 34)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'đ',(ulong)*(ushort *)(_v1_00 + lVar2 + 0x28),"i2(p + 36)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ē',(ulong)*(ushort *)(_v1_00 + lVar2 + 0x2c) & 0x3ff,
                      "i4(p + 38) >> 16 & 01777",0x1ed,"folder_perm",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ē',(long)*(int *)(_v1_00 + lVar2 + 0x2e),"i4(p + 42)",
                      (long)pcStack_18738 - (long)buff,"q - buff",(void *)0x0);
  sVar12 = strlen(folder_name);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĕ',_v1_00 + lVar2 + 0x32,"p + 46",folder_name,"folder_name",sVar12,
                      "strlen(folder_name)",(void *)0x0);
  sVar12 = strlen(folder_name);
  auVar4 = auStack_186e8;
  lVar14 = sVar12 + 0x32;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ė',(ulong)*(ushort *)((long)auStack_186e8 + sVar12 + 0x32),"i2(p)",0x5455,
                      "0x5455",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ė',(ulong)*(ushort *)((long)auVar4 + sVar12 + 0x34),"i2(p + 2)",9,"9",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ę',(long)*(char *)((long)auVar4 + sVar12 + 0x36),"p[4]",5,"5",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ę',(long)*(int *)((long)auVar4 + sVar12 + 0x37),"i4(p + 5)",t,"t",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ě',(long)*(int *)((long)auVar4 + sVar12 + 0x3b),"i4(p + 9)",t + 5,"t + 5",
                      (void *)0x0);
  uVar15 = (ulong)*(ushort *)((long)auVar4 + sVar12 + 0x34);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĝ',(ulong)*(ushort *)((long)auVar4 + uVar15 + 4 + lVar14),"i2(p)",0x7875,
                      "0x7875",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ĝ',(ulong)*(ushort *)((long)auVar4 + uVar15 + 6 + lVar14),"i2(p + 2)",0xb,
                      "11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ğ',(long)*(char *)((long)auVar4 + uVar15 + 8 + lVar14),"p[4]",1,"1",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ğ',(long)*(char *)((long)auVar4 + uVar15 + 9 + lVar14),"p[5]",4,"4",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ġ',(long)*(int *)((long)auVar4 + uVar15 + 10 + lVar14),"i4(p + 6)",0x1e,
                      "folder_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ġ',(long)*(char *)((long)auVar4 + uVar15 + 0xe + lVar14),"p[10]",4,"4",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ģ',(long)*(int *)((long)auVar4 + uVar15 + 0xf + lVar14),"i4(p + 11)",0x28,
                      "folder_gid",(void *)0x0);
  pcVar13 = pcStack_18738;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ħ',pcStack_18738,"q","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĩ',(ulong)*(ushort *)(pcVar13 + 4),"i2(q + 4)",0x14,"20",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ĩ',(ulong)*(ushort *)(pcVar13 + 6),"i2(q + 6)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ī',(ulong)*(ushort *)(pcVar13 + 8),"i2(q + 8)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ī',(ulong)*(ushort *)(pcVar13 + 10),"i2(q + 10)",
                      (long)(ptVar7->tm_sec / 2 + ptVar7->tm_min * 0x20 + ptVar7->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĭ',(ulong)*(ushort *)(pcVar13 + 0xc),"i2(q + 12)",
                      (long)(ptVar7->tm_mon * 0x20 + ptVar7->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar7->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ĭ',(long)*(int *)(pcVar13 + 0xe),"i4(q + 14)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Į',(long)*(int *)(pcVar13 + 0x12),"i4(q + 18)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'į',(long)*(int *)(pcVar13 + 0x16),"i4(q + 22)",0,"0",(void *)0x0);
  uVar1 = *(ushort *)(pcVar13 + 0x1a);
  sVar12 = strlen(folder_name);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'İ',(ulong)uVar1,"i2(q + 26)",sVar12,"strlen(folder_name)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ı',(ulong)*(ushort *)(pcVar13 + 0x1c),"i2(q + 28)",0x29,"41",(void *)0x0);
  lVar14 = uVar11 + sVar10;
  sVar10 = strlen(folder_name);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĳ',buff + lVar14 + 0x56,"q + 30",folder_name,"folder_name",sVar10,
                      "strlen(folder_name)",(void *)0x0);
  sVar10 = strlen(folder_name);
  pcVar13 = uStack_186f0;
  lVar2 = sVar10 + 0x38;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĵ',(ulong)*(ushort *)(uStack_186f0 + sVar10 + 0x38),"i2(q)",0x5455,
                      "0x5455",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ĵ',(ulong)*(ushort *)(pcVar13 + sVar10 + 0x3a),"i2(q + 2)",9,"9",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ķ',(long)pcVar13[sVar10 + 0x3c],"q[4]",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ķ',(long)*(int *)(pcVar13 + sVar10 + 0x3d),"i4(q + 5)",t,"t",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ĸ',(long)*(int *)(pcVar13 + sVar10 + 0x41),"i4(q + 9)",t + 5,"t + 5",
                      (void *)0x0);
  uVar11 = (ulong)*(ushort *)(pcVar13 + sVar10 + 0x3a);
  lVar3 = uVar11 + lVar2 + 4;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ĺ',(ulong)*(ushort *)(pcVar13 + uVar11 + 4 + lVar2),"i2(q)",0x7875,
                      "0x7875",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ļ',(ulong)*(ushort *)(pcVar13 + uVar11 + 6 + lVar2),"i2(q + 2)",0xb,"11",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ļ',(long)pcVar13[uVar11 + 8 + lVar2],"q[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ľ',(long)pcVar13[uVar11 + 9 + lVar2],"q[5]",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ľ',(long)*(int *)(pcVar13 + uVar11 + 10 + lVar2),"i4(q + 6)",0x1e,
                      "folder_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ŀ',(long)pcVar13[uVar11 + 0xe + lVar2],"q[10]",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ŀ',(long)*(int *)(pcVar13 + uVar11 + 0xf + lVar2),"i4(q + 11)",0x28,
                      "folder_gid",(void *)0x0);
  uVar11 = (ulong)*(ushort *)(pcVar13 + uVar11 + 6 + lVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ń',(ulong)*(ushort *)(pcVar13 + uVar11 + 4 + lVar3),"i2(q)",0x6c65,
                      "0x6c65",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ń',(ulong)*(ushort *)(pcVar13 + uVar11 + 6 + lVar3),"i2(q + 2)",9,"9",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ņ',(long)pcVar13[uVar11 + 8 + lVar3],"q[4]",7,"7",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ņ',(ulong)(byte)pcVar13[uVar11 + 10 + lVar3],"i2(q + 5) >> 8",3,"3",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ň',(ulong)*(ushort *)(pcVar13 + uVar11 + 0xb + lVar3),"i2(q + 7)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ň',(ulong)*(ushort *)(pcVar13 + uVar11 + 0xf + lVar3) & 0x3ff,
                      "i4(q + 9) >> 16 & 01777",0x1ed,"folder_perm",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                   ,L'ŋ',(uint)(pcVar13 + (ulong)*(ushort *)(pcVar13 + uVar11 + 6 + lVar3) +
                                           uVar11 + lVar3 + 8 ==
                                pcVar13 + (ulong)*(ushort *)(buff + lVar14 + 0x54) + lVar2),
                   "q == extra_start + i2(local_header + 28)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ő',pcVar13 + (ulong)*(ushort *)(buff + lVar14 + 0x54) + lVar2,"q",
                      "PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_compression_store)
{
	/* Buffer data */
	struct archive *a;
	struct archive_entry *entry;
	char buff[100000];
	const char *buffend;
	/* p is the pointer to walk over the central directory,
	 * q walks over the local headers, the data and the data descriptors. */
	const char *p, *q, *local_header, *extra_start;
	size_t used;

	/* File data */
	char file_name[] = "file";
	char file_data1[] = {'1', '2', '3', '4', '5'};
	char file_data2[] = {'6', '7', '8', '9', '0'};
	int file_perm = 00644;
	short file_uid = 10;
	short file_gid = 20;

	/* Folder data */
	char folder_name[] = "folder/";
	int folder_perm = 00755;
	short folder_uid = 30;
	short folder_gid = 40;

	/* Time data */
	time_t t = time(NULL);
	struct tm *tm = localtime(&t);

	/* Misc variables */
	unsigned long crc;

	/* Create new ZIP archive in memory without padding. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:compression=store"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_in_last_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Write entries. */

	/* Regular file */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_pathname(entry, file_name);
	archive_entry_set_mode(entry, S_IFREG | 0644);
	archive_entry_set_size(entry, sizeof(file_data1) + sizeof(file_data2));
	archive_entry_set_uid(entry, file_uid);
	archive_entry_set_gid(entry, file_gid);
	archive_entry_set_mtime(entry, t, 0);
	archive_entry_set_atime(entry, t + 3, 0);
	assertEqualIntA(a, 0, archive_write_header(a, entry));
	assertEqualIntA(a, sizeof(file_data1), archive_write_data(a, file_data1, sizeof(file_data1)));
	assertEqualIntA(a, sizeof(file_data2), archive_write_data(a, file_data2, sizeof(file_data2)));
	archive_entry_free(entry);

	/* Folder */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_pathname(entry, folder_name);
	archive_entry_set_mode(entry, S_IFDIR | folder_perm);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, folder_uid);
	archive_entry_set_gid(entry, folder_gid);
	archive_entry_set_mtime(entry, t, 0);
	archive_entry_set_ctime(entry, t + 5, 0);
	assertEqualIntA(a, 0, archive_write_header(a, entry));
	archive_entry_free(entry);

	/* Close the archive . */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	dumpfile("constructed.zip", buff, used);

	/* Remember the end of the archive in memory. */
	buffend = buff + used;

	/* Verify "End of Central Directory" record. */
	/* Get address of end-of-central-directory record. */
	p = buffend - 22; /* Assumes there is no zip comment field. */
	failure("End-of-central-directory begins with PK\\005\\006 signature");
	assertEqualMem(p, "PK\005\006", 4);
	failure("This must be disk 0");
	assertEqualInt(i2(p + 4), 0);
	failure("Central dir must start on disk 0");
	assertEqualInt(i2(p + 6), 0);
	failure("All central dir entries are on this disk");
	assertEqualInt(i2(p + 8), i2(p + 10));
	failure("CD start (%d) + CD length (%d) should == archive size - 22",
	    i4(p + 12), i4(p + 16));
	assertEqualInt(i4(p + 12) + i4(p + 16), used - 22);
	failure("no zip comment");
	assertEqualInt(i2(p + 20), 0);

	/* Get address of first entry in central directory. */
	p = buff + i4(buffend - 6);
	failure("Central file record at offset %d should begin with"
	    " PK\\001\\002 signature",
	    i4(buffend - 10));

	/* Verify file entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2(p + 4), 3 * 256 + 10); /* Version made by */
	assertEqualInt(i2(p + 6), 10); /* Version needed to extract */
	assertEqualInt(i2(p + 8), 8); /* Flags */
	assertEqualInt(i2(p + 10), 0); /* Compression method */
	assertEqualInt(i2(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = bitcrc32(0, file_data1, sizeof(file_data1));
	crc = bitcrc32(crc, file_data2, sizeof(file_data2));
	assertEqualInt(i4(p + 16), crc); /* CRC-32 */
	assertEqualInt(i4(p + 20), sizeof(file_data1) + sizeof(file_data2)); /* Compressed size */
	assertEqualInt(i4(p + 24), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	assertEqualInt(i2(p + 28), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2(p + 30), 28); /* Extra field length */
	assertEqualInt(i2(p + 32), 0); /* File comment length */
	assertEqualInt(i2(p + 34), 0); /* Disk number start */
	assertEqualInt(i2(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4(p + 38) >> 16 & 01777, file_perm); /* External file attrs */
	assertEqualInt(i4(p + 42), 0); /* Offset of local header */
	assertEqualMem(p + 46, file_name, strlen(file_name)); /* Pathname */
	p = p + 46 + strlen(file_name);
	assertEqualInt(i2(p), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2(p + 2), 9); /* 'UT' size */
	assertEqualInt(p[4], 3); /* 'UT' flags */
	assertEqualInt(i4(p + 5), t); /* 'UT' mtime */
	assertEqualInt(i4(p + 9), t + 3); /* 'UT' atime */
	p = p + 4 + i2(p + 2);
	assertEqualInt(i2(p), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2(p + 2), 11); /* 'ux' size */
/* TODO */
	p = p + 4 + i2(p + 2);

	/* Verify local header of file entry. */
	local_header = q = buff;
	assertEqualMem(q, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2(q + 4), 10); /* Version needed to extract */
	assertEqualInt(i2(q + 6), 8); /* Flags */
	assertEqualInt(i2(q + 8), 0); /* Compression method */
	assertEqualInt(i2(q + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(q + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4(q + 14), 0); /* CRC-32 */
	assertEqualInt(i4(q + 18), sizeof(file_data1) + sizeof(file_data2)); /* Compressed size */
	assertEqualInt(i4(q + 22), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	assertEqualInt(i2(q + 26), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2(q + 28), 41); /* Extra field length */
	assertEqualMem(q + 30, file_name, strlen(file_name)); /* Pathname */
	extra_start = q = q + 30 + strlen(file_name);
	assertEqualInt(i2(q), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2(q + 2), 9); /* 'UT' size */
	assertEqualInt(q[4], 3); /* 'UT' flags */
	assertEqualInt(i4(q + 5), t); /* 'UT' mtime */
	assertEqualInt(i4(q + 9), t + 3); /* 'UT' atime */
	q = q + 4 + i2(q + 2);

	assertEqualInt(i2(q), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2(q + 2), 11); /* 'ux' size */
	assertEqualInt(q[4], 1); /* 'ux' version */
	assertEqualInt(q[5], 4); /* 'ux' uid size */
	assertEqualInt(i4(q + 6), file_uid); /* 'Ux' UID */
	assertEqualInt(q[10], 4); /* 'ux' gid size */
	assertEqualInt(i4(q + 11), file_gid); /* 'Ux' GID */
	q = q + 4 + i2(q + 2);

	assertEqualInt(i2(q), 0x6c65); /* 'el' experimental extension header */
	assertEqualInt(i2(q + 2), 9); /* size */
	assertEqualInt(q[4], 7); /* Bitmap of fields included. */
	assertEqualInt(i2(q + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2(q + 7), 0); /* internal file attributes */
	assertEqualInt(i4(q + 9) >> 16 & 01777, file_perm); /* external file attributes */
	q = q + 4 + i2(q + 2);

	assert(q == extra_start + i2(local_header + 28));
	q = extra_start + i2(local_header + 28);

	/* Verify data of file entry. */
	assertEqualMem(q, file_data1, sizeof(file_data1));
	assertEqualMem(q + sizeof(file_data1), file_data2, sizeof(file_data2));
	q = q + sizeof(file_data1) + sizeof(file_data2);

	/* Verify data descriptor of file entry. */
	assertEqualMem(q, "PK\007\010", 4); /* Signature */
	assertEqualInt(i4(q + 4), crc); /* CRC-32 */
	assertEqualInt(i4(q + 8), sizeof(file_data1) + sizeof(file_data2)); /* Compressed size */
	assertEqualInt(i4(q + 12), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	q = q + 16;

	/* Verify folder entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2(p + 4), 3 * 256 + 20); /* Version made by */
	assertEqualInt(i2(p + 6), 20); /* Version needed to extract */
	assertEqualInt(i2(p + 8), 0); /* Flags */
	assertEqualInt(i2(p + 10), 0); /* Compression method */
	assertEqualInt(i2(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = 0;
	assertEqualInt(i4(p + 16), crc); /* CRC-32 */
	assertEqualInt(i4(p + 20), 0); /* Compressed size */
	assertEqualInt(i4(p + 24), 0); /* Uncompressed size */
	assertEqualInt(i2(p + 28), strlen(folder_name)); /* Pathname length */
	assertEqualInt(i2(p + 30), 28); /* Extra field length */
	assertEqualInt(i2(p + 32), 0); /* File comment length */
	assertEqualInt(i2(p + 34), 0); /* Disk number start */
	assertEqualInt(i2(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4(p + 38) >> 16 & 01777, folder_perm); /* External file attrs */
	assertEqualInt(i4(p + 42), q - buff); /* Offset of local header */
	assertEqualMem(p + 46, folder_name, strlen(folder_name)); /* Pathname */
	p = p + 46 + strlen(folder_name);
	assertEqualInt(i2(p), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2(p + 2), 9); /* 'UT' size */
	assertEqualInt(p[4], 5); /* 'UT' flags */
	assertEqualInt(i4(p + 5), t); /* 'UT' mtime */
	assertEqualInt(i4(p + 9), t + 5); /* 'UT' atime */
	p = p + 4 + i2(p + 2);
	assertEqualInt(i2(p), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2(p + 2), 11); /* 'ux' size */
	assertEqualInt(p[4], 1); /* 'ux' version */
	assertEqualInt(p[5], 4); /* 'ux' uid size */
	assertEqualInt(i4(p + 6), folder_uid); /* 'ux' UID */
	assertEqualInt(p[10], 4); /* 'ux' gid size */
	assertEqualInt(i4(p + 11), folder_gid); /* 'ux' GID */
	/*p = p + 4 + i2(p + 2);*/

	/* Verify local header of folder entry. */
	local_header = q;
	assertEqualMem(q, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2(q + 4), 20); /* Version needed to extract */
	assertEqualInt(i2(q + 6), 0); /* Flags */
	assertEqualInt(i2(q + 8), 0); /* Compression method */
	assertEqualInt(i2(q + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(q + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4(q + 14), 0); /* CRC-32 */
	assertEqualInt(i4(q + 18), 0); /* Compressed size */
	assertEqualInt(i4(q + 22), 0); /* Uncompressed size */
	assertEqualInt(i2(q + 26), strlen(folder_name)); /* Pathname length */
	assertEqualInt(i2(q + 28), 41); /* Extra field length */
	assertEqualMem(q + 30, folder_name, strlen(folder_name)); /* Pathname */
	extra_start = q = q + 30 + strlen(folder_name);
	assertEqualInt(i2(q), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2(q + 2), 9); /* 'UT' size */
	assertEqualInt(q[4], 5); /* 'UT' flags */
	assertEqualInt(i4(q + 5), t); /* 'UT' mtime */
	assertEqualInt(i4(q + 9), t + 5); /* 'UT' atime */
	q = q + 4 + i2(q + 2);
	assertEqualInt(i2(q), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2(q + 2), 11); /* 'ux' size */
	assertEqualInt(q[4], 1); /* 'ux' version */
	assertEqualInt(q[5], 4); /* 'ux' uid size */
	assertEqualInt(i4(q + 6), folder_uid); /* 'ux' UID */
	assertEqualInt(q[10], 4); /* 'ux' gid size */
	assertEqualInt(i4(q + 11), folder_gid); /* 'ux' GID */
	q = q + 4 + i2(q + 2);

	assertEqualInt(i2(q), 0x6c65); /* 'el' experimental extension header */
	assertEqualInt(i2(q + 2), 9); /* size */
	assertEqualInt(q[4], 7); /* bitmap of fields */
	assertEqualInt(i2(q + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2(q + 7), 0); /* internal file attributes */
	assertEqualInt(i4(q + 9) >> 16 & 01777, folder_perm); /* external file attributes */
	q = q + 4 + i2(q + 2);

	assert(q == extra_start + i2(local_header + 28));
	q = extra_start + i2(local_header + 28);

	/* There should not be any data in the folder entry,
	 * so the first central directory entry should be next: */
	assertEqualMem(q, "PK\001\002", 4); /* Signature */
}